

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26552d::CpuIntegrationTest_stack_Test::~CpuIntegrationTest_stack_Test
          (CpuIntegrationTest_stack_Test *this)

{
  CpuIntegrationTest_stack_Test *this_local;
  
  ~CpuIntegrationTest_stack_Test(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, stack) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 00     LDX #$00
    // $0602    a0 00     LDY #$00
    // $0604    8a        TXA
    // $0605    99 00 02  STA $0200,Y
    // $0608    48        PHA
    // $0609    e8        INX
    // $060a    c8        INY
    // $060b    c0 10     CPY #$10
    // $060d    d0 f5     BNE $0604
    // $060f    68        PLA
    // $0610    99 00 02  STA $0200,Y
    // $0613    c8        INY
    // $0614    c0 20     CPY #$20
    // $0616    d0 f7     BNE $060f
    // $0618    00        BRK
    load_hex_dump(0x0600,
            {0xa2,
                    0x00,
                    0xa0,
                    0x00,
                    0x8a,
                    0x99,
                    0x00,
                    0x02,
                    0x48,
                    0xe8,
                    0xc8,
                    0xc0,
                    0x10,
                    0xd0,
                    0xf5,
                    0x68});
    load_hex_dump(0x0610,
            {0x99,
                    0x00,
                    0x02,
                    0xc8,
                    0xc0,
                    0x20,
                    0xd0,
                    0xf7,
                    0x00,
                    0x00,
                    0x00}); // Needed for previous BRK dummy read

    // STA with absolute indexed addressing will first read from the effective
    // address before writing to it, so we need to initialize the fake mmu with
    // some data at those addresses.
    for (uint8_t i = 0; i <= 0x20; ++i) {
        mmu.write_byte(
                static_cast<uint16_t>(0x0200) + i, static_cast<uint8_t>(0xBA));
    }

    set_reset_address(0x0600);
    set_break_address(0xDEAD);

    expected.x = 0x10;
    expected.y = 0x20;
    expected.sp =
            registers.sp - static_cast<uint8_t>(3); // PC (2 bytes) + P (1 byte)
    expected.pc = 0xDEAD;
    expected.p = C_FLAG | Z_FLAG;

    const int pre_loop = 2 + 2;
    const int first_loop = (2 + 5 + 3 + 2 + 2 + 2) * 16 + 15 * 3 + 2;
    const int second_loop = (4 + 5 + 2 + 2) * 16 + 15 * 3 + 2;
    const int total_cycles = pre_loop + first_loop + second_loop + 7;

    EXPECT_EQ(total_cycles, run_until_brk());
    EXPECT_EQ(expected, registers);

    // Written in first loop
    for (uint8_t i = 0; i < 0x10; ++i) {
        EXPECT_EQ(i, mmu.read_byte(0x0200 + i));
    }
    // Written in second loop
    for (uint8_t i = 0; i < 0x10; ++i) {
        EXPECT_EQ(0x0F - i, mmu.read_byte(0x0210 + i));
    }
    // Verify stack content
    // BRK pushes three bytes (PC + 2 and P) and overwrites what the first loop
    // wrote.
    EXPECT_EQ(0x06, mmu.read_byte(kStackOffset + 0xFF));
    EXPECT_EQ(0x18 + 2, mmu.read_byte(kStackOffset + 0xFE));
    EXPECT_EQ(expected.p | B_FLAG, mmu.read_byte(kStackOffset + 0xFD));

    for (uint8_t i = 3; i < 0x10; ++i) {
        EXPECT_EQ(i, mmu.read_byte(kStackOffset + 0xFF - i));
    }
}